

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newthread(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  global_State *g;
  StkId pTVar2;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x11b,"lua_State *lua_newthread(lua_State *)");
  }
  g = L->l_G;
  if (0 < g->GCdebt) {
    luaC_step(L);
  }
  puVar6 = (undefined8 *)luaM_realloc_(L,(void *)0x0,8,0xe0);
  L_00 = (lua_State *)(puVar6 + 2);
  *(byte *)((long)puVar6 + 0x19) = g->currentwhite & 0x18;
  *(undefined1 *)(puVar6 + 3) = 8;
  puVar6[2] = g->allgc;
  g->allgc = (GCObject *)L_00;
  pTVar2 = L->top;
  (pTVar2->value_).gc = (GCObject *)L_00;
  pTVar2->tt_ = 0x8008;
  if ((*(char *)(puVar6 + 3) != '\b') ||
     ((*(byte *)((long)puVar6 + 0x19) & (L->l_G->currentwhite ^ 0x18)) != 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x126,"lua_State *lua_newthread(lua_State *)");
  }
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (L->ci->top < pTVar2 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x127,"lua_State *lua_newthread(lua_State *)");
  }
  preinit_thread(L_00,g);
  *(lu_byte *)(puVar6 + 0x1b) = L->hookmask;
  iVar1 = L->basehookcount;
  *(int *)((long)puVar6 + 0xcc) = iVar1;
  puVar6[0x17] = L->hook;
  *(int *)(puVar6 + 0x1a) = iVar1;
  uVar5 = *(undefined8 *)&g->mainthread[-1].hookmask;
  *puVar6 = *(undefined8 *)&g->mainthread[-1].hookcount;
  puVar6[1] = uVar5;
  lVar3._0_1_ = L[-1].hookmask;
  lVar3._1_1_ = L[-1].allowhook;
  lVar3._2_2_ = L[-1].nci;
  lVar3._4_1_ = L[-1].magic;
  lVar3._5_3_ = *(undefined3 *)&L[-1].field_0xcd;
  if (puVar6[1] == lVar3) {
    stack_init(L_00,L);
    piVar4 = *(int **)&L[-1].hookmask;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      return L_00;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x132,"lua_State *lua_newthread(lua_State *)");
  }
  __assert_fail("((struct L_EXTRA*)(((void *)((char *)(L1) - sizeof(struct L_EXTRA)))))->plock == ((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x130,"lua_State *lua_newthread(lua_State *)");
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g;
  lua_State *L1;
  lua_lock(L);
  g = G(L);
  luaC_checkGC(L);
  /* create new thread */
  L1 = &cast(LX *, luaM_newobject(L, LUA_TTHREAD, sizeof(LX)))->l;
  L1->marked = luaC_white(g);
  L1->tt = LUA_TTHREAD;
  /* link it on list 'allgc' */
  L1->next = g->allgc;
  g->allgc = obj2gco(L1);
  /* anchor it on L stack */
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}